

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::MessageSetItemByteSize
                 (FieldDescriptor *field,Message *message)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  Reflection *this;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  iVar1 = 0x1f;
  if ((*(uint *)(field + 0x44) | 1) != 0) {
    for (; (*(uint *)(field + 0x44) | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  pMVar4 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  uVar3 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[9])(pMVar4);
  iVar2 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  return CONCAT44(extraout_var,uVar3) + 4 + (ulong)(iVar1 * 9 + 0x49U >> 6) +
         (ulong)(iVar2 * 9 + 0x49U >> 6);
}

Assistant:

size_t WireFormat::MessageSetItemByteSize(const FieldDescriptor* field,
                                          const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(field->number());

  // message
  const Message& sub_message = message_reflection->GetMessage(message, field);
  size_t message_size = sub_message.ByteSizeLong();

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}